

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O1

bool __thiscall LTFlightData::DetermineAcModel(LTFlightData *this)

{
  iterator *this_00;
  string *psVar1;
  pointer pcVar2;
  size_t sVar3;
  size_type sVar4;
  LTAircraft *pLVar5;
  _Map_pointer pppVar6;
  _Elt_pointer ppVar7;
  positionTy *p1;
  int iVar8;
  reference ppVar9;
  _Alloc_hider __s2;
  _Alloc_hider __s1;
  bool bVar10;
  double dVar11;
  string prevType;
  
  iVar8 = pthread_mutex_lock((pthread_mutex_t *)&this->dataAccessMutex);
  if (iVar8 != 0) {
    std::__throw_system_error(iVar8);
  }
  pcVar2 = (this->statData).acTypeIcao._M_dataplus._M_p;
  prevType._M_dataplus._M_p = (pointer)&prevType.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&prevType,pcVar2,pcVar2 + (this->statData).acTypeIcao._M_string_length);
  psVar1 = &(this->statData).acTypeIcao;
  if (dataRefs.cslFixAcIcaoType._M_string_length == 0) {
    if (prevType._M_string_length != 0) {
      if (prevType._M_string_length == dataRefs.sDefaultCarIcaoType._M_string_length) {
        iVar8 = bcmp(prevType._M_dataplus._M_p,dataRefs.sDefaultCarIcaoType._M_dataplus._M_p,
                     prevType._M_string_length);
        if (iVar8 == 0) goto LAB_001751fb;
      }
      goto LAB_0017541d;
    }
LAB_001751fb:
    ModelIcaoType::getIcaoType(&(this->statData).mdl);
    std::__cxx11::string::_M_assign((string *)psVar1);
    sVar4 = (this->statData).acTypeIcao._M_string_length;
    if (sVar4 == 0) {
      if (prevType._M_string_length == dataRefs.sDefaultCarIcaoType._M_string_length) {
        if (prevType._M_string_length != 0) {
          iVar8 = bcmp(prevType._M_dataplus._M_p,dataRefs.sDefaultCarIcaoType._M_dataplus._M_p,
                       prevType._M_string_length);
          if (iVar8 != 0) goto LAB_001753e5;
        }
        pLVar5 = this->pAc;
        if (pLVar5 != (LTAircraft *)0x0) {
          if (((pLVar5->super_Aircraft).bOnGrnd != true) || (80.0 < (pLVar5->speed).currSpeed_kt)) {
            if (pLVar5 != (LTAircraft *)0x0) goto LAB_001753e5;
            goto LAB_00175306;
          }
LAB_0017544f:
          std::__cxx11::string::_M_assign((string *)psVar1);
          goto LAB_00175195;
        }
LAB_00175306:
        pppVar6 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
        ppVar7 = (this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl
                 .super__Deque_impl_data._M_start._M_cur;
        if ((1 < ((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                        _M_impl.super__Deque_impl_data._M_start._M_last - (long)ppVar7 >> 3) *
                 -0x71c71c71c71c71c7 +
                 ((long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_cur -
                  (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                 -0x71c71c71c71c71c7 +
                 (((long)pppVar6 -
                   (long)(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(pppVar6 == (_Map_pointer)0x0)) * 7) &&
           (((ushort)ppVar7->f & 0x300) == 0x200)) {
          this_00 = &(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>.
                     _M_impl.super__Deque_impl_data._M_start;
          ppVar9 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[]
                             (this_00,1);
          if (((ushort)ppVar9->f & 0x300) == 0x200) {
            p1 = this_00->_M_cur;
            ppVar9 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[]
                               (this_00,1);
            dVar11 = CoordDistance(p1,ppVar9);
            if ((dVar11 / (ppVar9->_ts - p1->_ts)) * 1.94384 <= 80.0) goto LAB_0017544f;
          }
        }
      }
LAB_001753e5:
      (this->statData).acTypeIcao._M_string_length = 0;
      *(this->statData).acTypeIcao._M_dataplus._M_p = '\0';
      bVar10 = true;
      if (prevType._M_string_length != (this->statData).acTypeIcao._M_string_length)
      goto LAB_0017541f;
      if (prevType._M_string_length != 0) {
        __s2._M_p = (psVar1->_M_dataplus)._M_p;
        __s1._M_p = prevType._M_dataplus._M_p;
        goto LAB_001751bb;
      }
    }
    else {
      if (prevType._M_string_length != sVar4) {
LAB_0017524a:
        bVar10 = true;
        if ((int)dataRefs.iLogLevel < 2) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFlightData.cpp"
                 ,0xa34,"DetermineAcModel",logINFO,
                 "Tracking data for \'%s\' (man \'%s\', mdl \'%s\') lacks ICAO a/c type code, but derived %s from mdl text"
                 ,(this->acKey).key._M_dataplus._M_p,(this->statData).man._M_dataplus._M_p,
                 (this->statData).mdl._M_dataplus._M_p,(this->statData).acTypeIcao._M_dataplus._M_p)
          ;
        }
        goto LAB_0017541f;
      }
      if (prevType._M_string_length != 0) {
        iVar8 = bcmp(prevType._M_dataplus._M_p,(psVar1->_M_dataplus)._M_p,prevType._M_string_length)
        ;
        if (iVar8 != 0) goto LAB_0017524a;
      }
    }
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
LAB_00175195:
    sVar3 = (this->statData).acTypeIcao._M_string_length;
    bVar10 = true;
    if (sVar3 != prevType._M_string_length) goto LAB_0017541f;
    if (sVar3 != 0) {
      prevType._M_string_length = sVar3;
      __s2._M_p = prevType._M_dataplus._M_p;
      __s1._M_p = (psVar1->_M_dataplus)._M_p;
LAB_001751bb:
      iVar8 = bcmp(__s1._M_p,__s2._M_p,prevType._M_string_length);
      bVar10 = iVar8 != 0;
      goto LAB_0017541f;
    }
  }
LAB_0017541d:
  bVar10 = false;
LAB_0017541f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prevType._M_dataplus._M_p != &prevType.field_2) {
    operator_delete(prevType._M_dataplus._M_p,prevType.field_2._M_allocated_capacity + 1);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
  return bVar10;
}

Assistant:

bool LTFlightData::DetermineAcModel()
{
    // access guarded by a mutex
    std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

    const std::string prevType = statData.acTypeIcao;

    // Debugging model matching: If the model is fixed, then it is what it is
    if (!dataRefs.cslFixAcIcaoType.empty()) {
        statData.acTypeIcao = dataRefs.cslFixAcIcaoType;
        return statData.acTypeIcao != prevType;
    }
    
    // We don't change the a/c type if it is already something reasonable
    if (!prevType.empty() &&
        prevType != dataRefs.GetDefaultCarIcaoType())
        return false;
    
    // Try finding a CSL model by interpreting the human-readable model text
    statData.acTypeIcao = ModelIcaoType::getIcaoType(statData.mdl);
    if ( !statData.acTypeIcao.empty() )
    {
        // yea, found something by mdl!
        if (prevType != statData.acTypeIcao) {
            LOG_MSG(logINFO,ERR_NO_AC_TYPE_BUT_MDL,
                    key().c_str(),
                    statData.man.c_str(), statData.mdl.c_str(),
                    statData.acTypeIcao.c_str());
            return true;
        }
        return false;
    }
    
    // Ground vehicle maybe? Shall be on the ground then with reasonable speed
    // (The info if this _could_ be a car is delivered by the channels via
    //  the acTypeIcao, here we just validate if the dynamic situation
    //  fits a car.)
    if (prevType == dataRefs.GetDefaultCarIcaoType())
    {
        if ((pAc &&                                 // plane exists?
             pAc->IsOnGrnd() &&                     // must be on ground with reasonable speed
             pAc->GetSpeed_kt() <= MDL_CAR_MAX_TAXI) ||
            (!pAc &&                                // no plane yet:
             posDeque.size() >= 2 &&                // analyse ground status of and speed between first two positions
             posDeque.front().IsOnGnd() && posDeque[1].IsOnGnd() &&
             posDeque.front().speed_kt(posDeque[1]) <= MDL_CAR_MAX_TAXI))
        {
            // We now decide for surface vehicle
            statData.acTypeIcao = dataRefs.GetDefaultCarIcaoType();
            return statData.acTypeIcao != prevType;
        }
    }
            
    // we have no better idea than default
    statData.acTypeIcao.clear();
    return prevType != statData.acTypeIcao;
}